

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O2

void __thiscall Memory::CacheAllocator::CheckIsAllZero(CacheAllocator *this,bool lockdown)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BigBlock *pBVar4;
  ArenaMemoryBlock *pAVar5;
  DWORD local_40;
  DWORD local_3c;
  DWORD oldProtect;
  DWORD oldProtect_1;
  
  pBVar4 = (BigBlock *)
           &(this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
            super_ArenaData;
  pAVar5 = (ArenaMemoryBlock *)
           &(this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
            super_ArenaData.mallocBlocks;
  _oldProtect = this;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while (pAVar5 = (pAVar5->field_0).next, pAVar5 != (ArenaMemoryBlock *)0x0) {
    bVar2 = IsAll((byte *)(pAVar5 + 1),pAVar5->nbytes,'\0');
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                         ,0x5f1,"(IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0))",
                         "IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0)");
      if (!bVar2) goto LAB_0060f943;
      *puVar3 = 0;
    }
  }
  if ((_oldProtect->verifiedAllZeroAndLockedDown & lockdown) == 0) {
    ArenaData::UpdateCacheBlock((ArenaData *)pBVar4);
    while (pBVar4 = (pBVar4->super_ArenaMemoryBlock).field_0.nextBigBlock, pBVar4 != (BigBlock *)0x0
          ) {
      bVar2 = IsAll((byte *)(pBVar4 + 1),pBVar4->currentByte,'\0');
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                           ,0x5fd,"(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0))",
                           "IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0)");
        if (!bVar2) goto LAB_0060f943;
        *puVar3 = 0;
      }
      if (lockdown) {
        VirtualProtect(pBVar4->allocation + 1,pBVar4->allocation->pageCount * 0x1000 - 0x10,2,
                       &local_40);
      }
    }
    pBVar4 = (BigBlock *)
             &(_oldProtect->
              super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
              super_ArenaData.fullBlocks;
    while (pBVar4 = (pBVar4->super_ArenaMemoryBlock).field_0.nextBigBlock, pBVar4 != (BigBlock *)0x0
          ) {
      bVar2 = IsAll((byte *)(pBVar4 + 1),pBVar4->currentByte,'\0');
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                           ,0x609,"(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0))",
                           "IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0)");
        if (!bVar2) {
LAB_0060f943:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      if (lockdown) {
        VirtualProtect(pBVar4->allocation + 1,pBVar4->allocation->pageCount * 0x1000 - 0x10,2,
                       &local_3c);
      }
    }
    if (lockdown) {
      _oldProtect->verifiedAllZeroAndLockedDown = true;
    }
  }
  return;
}

Assistant:

void CacheAllocator::CheckIsAllZero(bool lockdown)
{
    ArenaMemoryBlock * memoryBlock = this->mallocBlocks;
    while (memoryBlock != nullptr)
    {
        Assert(IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0));
        memoryBlock = memoryBlock->next;
    }

    if (verifiedAllZeroAndLockedDown && lockdown)
    {
        return;
    }
    UpdateCacheBlock();
    BigBlock *blockp = this->bigBlocks;
    while (blockp != NULL)
    {
        Assert(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0));
        if (lockdown)
        {
            DWORD oldProtect;
            VirtualProtect(blockp->allocation->GetAddress(), blockp->allocation->GetSize(), PAGE_READONLY, &oldProtect);
        }
        blockp = blockp->nextBigBlock;
    }

    blockp = this->fullBlocks;
    while (blockp != NULL)
    {
        Assert(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0));
        if (lockdown)
        {
            DWORD oldProtect;
            VirtualProtect(blockp->allocation->GetAddress(), blockp->allocation->GetSize(), PAGE_READONLY, &oldProtect);
        }
        blockp = blockp->nextBigBlock;
    }

    if (lockdown)
    {
        verifiedAllZeroAndLockedDown = true;
    }
}